

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool picojson::
     _parse_object<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (default_parse_context *ctx,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  bool bVar1;
  bool bVar2;
  string key;
  
  bVar1 = default_parse_context::parse_object_start(ctx);
  if (bVar1) {
    bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::expect(in,0x7d);
    bVar2 = true;
    if (!bVar1) {
      do {
        key._M_string_length = 0;
        key.field_2._M_local_buf[0] = '\0';
        key._M_dataplus._M_p = (pointer)&key.field_2;
        bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x22);
        if (!bVar1) {
LAB_00109bab:
          std::__cxx11::string::~string((string *)&key);
          goto LAB_00109bb5;
        }
        bVar1 = _parse_string<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (&key,in);
        if (!bVar1) goto LAB_00109bab;
        bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x3a);
        if (!bVar1) goto LAB_00109bab;
        bVar1 = default_parse_context::
                parse_object_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (ctx,in,&key);
        std::__cxx11::string::~string((string *)&key);
        if (!bVar1) goto LAB_00109bb5;
        bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x2c);
      } while (bVar1);
      bVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::expect(in,0x7d);
    }
  }
  else {
LAB_00109bb5:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool _parse_object(Context &ctx, input<Iter> &in) {
  if (!ctx.parse_object_start()) {
    return false;
  }
  if (in.expect('}')) {
    return true;
  }
  do {
    std::string key;
    if (!in.expect('"') || !_parse_string(key, in) || !in.expect(':')) {
      return false;
    }
    if (!ctx.parse_object_item(in, key)) {
      return false;
    }
  } while (in.expect(','));
  return in.expect('}');
}